

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

cio_error bs_read_until_blocks
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,char *delim,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error bs_read_until_blocks(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, const char *delim, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	(void)buffered_stream;
	(void)buffer;
	(void)delim;
	(void)handler;
	(void)handler_context;

	return CIO_SUCCESS;
}